

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

int side3_4d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar54;
  undefined1 auVar53 [16];
  double dVar55;
  double dVar56;
  double dVar57;
  double dStack_1d0;
  undefined8 local_188;
  
  dVar36 = *p0;
  dVar45 = *p1 - dVar36;
  dVar50 = p0[3];
  dVar42 = p1[3] - dVar50;
  dVar44 = p0[1];
  dVar5 = p0[2];
  dVar31 = p1[1] - dVar44;
  dVar48 = p1[2] - dVar5;
  dVar22 = q2[3] - dVar50;
  dVar24 = p2[1] - dVar44;
  dVar51 = q2[2] - dVar5;
  dVar54 = *p2 - dVar36;
  dVar17 = q0[2] - dVar5;
  dVar46 = ABS(dVar31);
  if (ABS(dVar31) <= ABS(dVar42)) {
    dVar46 = ABS(dVar42);
  }
  dVar2 = ABS(dVar48);
  if (ABS(dVar48) <= dVar46) {
    dVar2 = dVar46;
  }
  dVar46 = ABS(dVar45);
  if (ABS(dVar45) <= dVar2) {
    dVar46 = dVar2;
  }
  dVar2 = *q0 - *p0;
  dVar6 = q0[1] - p0[1];
  auVar1._8_4_ = SUB84(dVar6,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar6 >> 0x20);
  dVar3 = ABS(dVar2);
  if (ABS(dVar2) <= ABS(dVar6)) {
    dVar3 = ABS(dVar6);
  }
  dVar6 = ABS(dVar17);
  if (ABS(dVar17) <= dVar3) {
    dVar6 = dVar3;
  }
  dVar3 = q0[3] - dVar50;
  dVar4 = ABS(dVar3);
  if (ABS(dVar3) <= dVar6) {
    dVar4 = dVar6;
  }
  dVar49 = *q1 - dVar36;
  dVar6 = ABS(dVar49);
  if (ABS(dVar49) <= dVar4) {
    dVar6 = dVar4;
  }
  dVar32 = q1[1] - dVar44;
  dVar4 = ABS(dVar32);
  if (ABS(dVar32) <= dVar6) {
    dVar4 = dVar6;
  }
  dVar6 = q1[2] - dVar5;
  dVar26 = ABS(dVar6);
  if (ABS(dVar6) <= dVar4) {
    dVar26 = dVar4;
  }
  dVar55 = q1[3] - dVar50;
  dVar4 = ABS(dVar55);
  if (ABS(dVar55) <= dVar26) {
    dVar4 = dVar26;
  }
  dVar37 = *q2 - dVar36;
  dVar26 = ABS(dVar37);
  if (ABS(dVar37) <= dVar4) {
    dVar26 = dVar4;
  }
  dVar4 = p2[3] - dVar50;
  dVar25 = q2[1] - dVar44;
  dVar30 = p2[2] - dVar5;
  auVar28._0_8_ = ABS(dVar25);
  auVar28._8_8_ = ABS(dVar30);
  auVar29._8_4_ = SUB84(ABS(dVar4),0);
  auVar29._0_8_ = dVar26;
  auVar29._12_4_ = (int)((ulong)ABS(dVar4) >> 0x20);
  auVar29 = maxpd(auVar28,auVar29);
  auVar53._0_8_ = ABS(dVar51);
  auVar53._8_8_ = ABS(dVar54);
  auVar29 = maxpd(auVar53,auVar29);
  auVar13._0_8_ = ABS(dVar22);
  auVar13._8_8_ = ABS(dVar24);
  auVar29 = maxpd(auVar13,auVar29);
  dVar14 = auVar29._8_8_;
  uVar15 = auVar29._8_4_;
  uVar16 = auVar29._12_4_;
  uVar18 = SUB84(dVar46,0);
  uVar20 = (undefined4)((ulong)dVar46 >> 0x20);
  dVar26 = dVar46;
  if ((dVar46 <= dVar14) && (uVar15 = uVar18, uVar16 = uVar20, dVar46 < dVar14)) {
    dVar26 = dVar14;
  }
  dVar12 = auVar29._0_8_;
  uVar19 = auVar29._0_4_;
  uVar21 = auVar29._4_4_;
  if (((double)CONCAT44(uVar16,uVar15) < dVar12 || (double)CONCAT44(uVar16,uVar15) == dVar12) &&
     (uVar19 = uVar15, uVar21 = uVar16, dVar26 < dVar12)) {
    dVar26 = dVar12;
  }
  iVar9 = 0;
  iVar8 = 0;
  if ((1.895283954029418e-74 < (double)CONCAT44(uVar21,uVar19) ||
       (double)CONCAT44(uVar21,uVar19) == 1.895283954029418e-74) &&
     (iVar8 = iVar9, dVar26 <= 1.2980742146337065e+33)) {
    dStack_1d0 = auVar1._8_8_;
    dVar52 = dVar42 * dVar55 + dVar48 * dVar6 + dVar45 * dVar49 + dVar31 * dVar32;
    dVar57 = dVar42 * dVar22 + dVar48 * dVar51 + dVar45 * dVar37 + dVar31 * dVar25;
    dVar26 = dVar4 * dVar55 + dVar30 * dVar6 + dVar54 * dVar49 + dVar24 * dVar32;
    dVar27 = dVar4 * dVar22 + dVar30 * dVar51 + dVar54 * dVar37 + dVar24 * dVar25;
    dVar43 = dVar42 * dVar3 + dVar48 * dVar17 + dVar45 * dVar2 + dVar31 * dStack_1d0;
    dVar47 = dVar4 * dVar3 + dVar30 * dVar17 + dVar54 * dVar2 + dVar24 * dStack_1d0;
    dVar52 = dVar52 + dVar52;
    dVar57 = dVar57 + dVar57;
    dVar26 = dVar26 + dVar26;
    dVar27 = dVar27 + dVar27;
    dVar43 = dVar43 + dVar43;
    dVar47 = dVar47 + dVar47;
    dVar38 = dVar52 * dVar27 - dVar26 * dVar57;
    dVar33 = dVar57 * dVar47 - dVar27 * dVar43;
    dVar23 = dVar43 * dVar26 - dVar47 * dVar52;
    dVar56 = dVar38 + dVar33 + dVar23;
    dVar35 = dVar46 * dVar12 * dVar14 * dVar12 * 1.7244368241093199e-13;
    iVar9 = 1;
    if ((dVar35 < dVar56) || (iVar9 = -1, dVar56 < -dVar35)) {
      dVar36 = *p3 - dVar36;
      dVar44 = p3[1] - dVar44;
      dVar5 = p3[2] - dVar5;
      dVar50 = p3[3] - dVar50;
      dVar35 = ABS(dVar36);
      if (ABS(dVar36) <= dVar46) {
        dVar35 = dVar46;
      }
      dVar34 = ABS(dVar50);
      if (ABS(dVar50) <= dVar35) {
        dVar34 = dVar35;
      }
      dVar35 = ABS(dVar5);
      if (ABS(dVar5) <= dVar34) {
        dVar35 = dVar34;
      }
      dVar34 = ABS(dVar44);
      if (ABS(dVar44) <= dVar35) {
        dVar34 = dVar35;
      }
      dVar35 = dVar34;
      if (dVar34 <= dVar46) {
        dVar35 = dVar46;
      }
      dVar39 = dVar12;
      if (dVar12 <= dVar35) {
        dVar39 = dVar35;
      }
      uVar15 = auVar29._0_4_;
      uVar16 = auVar29._4_4_;
      if (dVar12 <= dVar46) {
        uVar15 = uVar18;
        uVar16 = uVar20;
      }
      dVar35 = (double)CONCAT44(uVar16,uVar15);
      if ((double)CONCAT44(uVar16,uVar15) <= dVar39) {
        dVar35 = dVar39;
      }
      dVar39 = dVar35;
      if (dVar35 <= dVar46) {
        dVar39 = dVar46;
      }
      dVar46 = dVar34;
      if (dVar34 <= dVar39) {
        dVar46 = dVar39;
      }
      dVar46 = (double)(~-(ulong)(dVar46 < dVar14) & (ulong)dVar46 |
                       (ulong)dVar14 & -(ulong)(dVar46 < dVar14));
      dVar39 = (double)(~-(ulong)(dVar34 < dVar35) & (ulong)dVar35 |
                       (ulong)dVar34 & -(ulong)(dVar34 < dVar35));
      uVar10 = -(ulong)(dVar46 < dVar12);
      uVar11 = -(ulong)(dVar14 < dVar39);
      dVar46 = (double)(~uVar10 & (ulong)dVar46 | (ulong)dVar12 & uVar10);
      dVar39 = (double)(~uVar11 & (ulong)dVar39 | (ulong)dVar14 & uVar11);
      uVar10 = -(ulong)(dVar46 < (double)CONCAT44(uVar16,uVar15));
      uVar11 = -(ulong)(dVar12 < dVar39);
      dVar40 = (double)(~uVar10 & (ulong)dVar46 | CONCAT44(uVar16,uVar15) & uVar10);
      dVar41 = (double)(~uVar11 & (ulong)dVar39 | (ulong)dVar12 & uVar11);
      dVar46 = dVar35;
      dVar39 = dVar40;
      if ((dVar41 <= dVar40) && (dVar39 = dVar41, dVar35 < dVar40)) {
        dVar46 = dVar40;
      }
      if (dVar46 <= 1.2980742146337065e+33) {
        dVar46 = (double)CONCAT44(uVar16,uVar15);
        if (dVar39 <= (double)CONCAT44(uVar16,uVar15)) {
          dVar46 = dVar39;
        }
        if (4.1460764440172624e-50 <= dVar46) {
          local_188 = (double)CONCAT44(uVar16,uVar15);
          dVar31 = dVar42 * dVar42 + dVar48 * dVar48 + dVar45 * dVar45 + dVar31 * dVar31;
          dVar24 = dVar4 * dVar4 + dVar30 * dVar30 + dVar54 * dVar54 + dVar24 * dVar24;
          dVar42 = dVar55 * dVar50 + dVar6 * dVar5 + dVar49 * dVar36 + dVar32 * dVar44;
          dVar45 = dVar3 * dVar50 + dVar17 * dVar5 + dVar2 * dVar36 + dStack_1d0 * dVar44;
          dVar46 = dVar22 * dVar50 + dVar51 * dVar5 + dVar37 * dVar36 + dVar25 * dVar44;
          dVar17 = dVar34 * dVar12 * dVar14 * local_188 * dVar35 * dVar40 * 4.380468888011788e-12;
          dVar36 = dVar56 * (dVar50 * dVar50 + dVar5 * dVar5 + dVar36 * dVar36 + dVar44 * dVar44) -
                   ((dVar23 + (dVar47 - dVar26) * dVar31 + (dVar52 - dVar43) * dVar24) *
                    (dVar46 + dVar46) +
                   (dVar33 + (dVar27 - dVar47) * dVar31 + (dVar43 - dVar57) * dVar24) *
                   (dVar42 + dVar42) +
                   (dVar45 + dVar45) *
                   (dVar38 + (dVar26 - dVar27) * dVar31 + (dVar57 - dVar52) * dVar24));
          iVar7 = 1;
          if ((dVar17 < dVar36) || (iVar7 = -1, dVar36 < -dVar17)) {
            iVar8 = iVar7 * iVar9;
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

inline int side3_4d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double l1;
    l1 = (1 * ((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double l2;
    l2 = (1 * ((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double l3;
    l3 = (1 * ((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double a10;
    a10 = (2 * ((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double a11;
    a11 = (2 * ((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double a12;
    a12 = (2 * ((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)));
    double a20;
    a20 = (2 * ((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)));
    double a21;
    a21 = (2 * ((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)));
    double a22;
    a22 = (2 * ((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)));
    double a30;
    a30 = (2 * ((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)));
    double a31;
    a31 = (2 * ((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)));
    double a32;
    a32 = (2 * ((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p1_3_p0_3);
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    double max2 = fabs(p2_3_p0_3);
    if( (max2 < fabs(p2_2_p0_2)) )
    {
        max2 = fabs(p2_2_p0_2);
    } 
    if( (max2 < fabs(p2_0_p0_0)) )
    {
        max2 = fabs(p2_0_p0_0);
    } 
    if( (max2 < fabs(p2_1_p0_1)) )
    {
        max2 = fabs(p2_1_p0_1);
    } 
    double max3 = fabs(q0_1_p0_1);
    if( (max3 < fabs(q0_0_p0_0)) )
    {
        max3 = fabs(q0_0_p0_0);
    } 
    if( (max3 < fabs(q0_2_p0_2)) )
    {
        max3 = fabs(q0_2_p0_2);
    } 
    if( (max3 < fabs(q0_3_p0_3)) )
    {
        max3 = fabs(q0_3_p0_3);
    } 
    if( (max3 < fabs(q1_0_p0_0)) )
    {
        max3 = fabs(q1_0_p0_0);
    } 
    if( (max3 < fabs(q1_1_p0_1)) )
    {
        max3 = fabs(q1_1_p0_1);
    } 
    if( (max3 < fabs(q1_2_p0_2)) )
    {
        max3 = fabs(q1_2_p0_2);
    } 
    if( (max3 < fabs(q1_3_p0_3)) )
    {
        max3 = fabs(q1_3_p0_3);
    } 
    if( (max3 < fabs(q2_0_p0_0)) )
    {
        max3 = fabs(q2_0_p0_0);
    } 
    if( (max3 < fabs(q2_1_p0_1)) )
    {
        max3 = fabs(q2_1_p0_1);
    } 
    if( (max3 < fabs(q2_2_p0_2)) )
    {
        max3 = fabs(q2_2_p0_2);
    } 
    if( (max3 < fabs(q2_3_p0_3)) )
    {
        max3 = fabs(q2_3_p0_3);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 1.89528395402941802921e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.72443682410931985179e-13 * (((max1 * max3) * max2) * max3));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4 = max1;
    double max5 = max1;
    double max6 = max1;
    if( (max6 < fabs(p3_0_p0_0)) )
    {
        max6 = fabs(p3_0_p0_0);
    } 
    if( (max6 < fabs(p3_3_p0_3)) )
    {
        max6 = fabs(p3_3_p0_3);
    } 
    if( (max6 < fabs(p3_2_p0_2)) )
    {
        max6 = fabs(p3_2_p0_2);
    } 
    if( (max6 < fabs(p3_1_p0_1)) )
    {
        max6 = fabs(p3_1_p0_1);
    } 
    if( (max5 < max6) )
    {
        max5 = max6;
    } 
    if( (max5 < max3) )
    {
        max5 = max3;
    } 
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    if( (max5 < max7) )
    {
        max5 = max7;
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    if( (max4 < max2) )
    {
        max4 = max2;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    if( (max4 < max7) )
    {
        max4 = max7;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max5;
    upper_bound_1 = max5;
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    if( (lower_bound_1 < 4.14607644401726239868e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.38046888801178809320e-12 * (((((max6 * max3) * max2) * max7) * max5) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}